

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

bool __thiscall
ONX_Model::Read(ONX_Model *this,wchar_t *filename,uint table_filter,uint model_object_type_filter,
               ON_TextLog *error_log)

{
  bool bVar1;
  FILE *fp;
  bool bVar2;
  ON_BinaryFile file;
  ON_BinaryFile OStack_258;
  
  if (filename == (wchar_t *)0x0) {
    bVar2 = true;
  }
  else {
    fp = ON::OpenFile(filename,L"rb");
    bVar2 = fp == (FILE *)0x0;
    if (!bVar2) {
      ON_BinaryFile::ON_BinaryFile(&OStack_258,read3dm,fp);
      bVar1 = Read(this,&OStack_258.super_ON_BinaryArchive,table_filter,model_object_type_filter,
                   error_log);
      ON::CloseFile(fp);
      ON_BinaryFile::~ON_BinaryFile(&OStack_258);
      bVar2 = false;
      goto LAB_00469d9c;
    }
  }
  bVar1 = false;
LAB_00469d9c:
  if (bVar2) {
    Reset(this);
  }
  return bVar1;
}

Assistant:

bool ONX_Model::Read( 
    const wchar_t* filename,
    unsigned int table_filter,
    unsigned int model_object_type_filter,
    ON_TextLog* error_log
    )
{
  bool bCallReset = true;
  bool rc = false;

  if ( 0 != filename )
  {
    FILE* fp = ON::OpenFile(filename,L"rb");
    if ( 0 != fp )
    {
      bCallReset = false;
      ON_BinaryFile file(ON::archive_mode::read3dm,fp);
      rc = Read(file, table_filter, model_object_type_filter, error_log);
      ON::CloseFile(fp);
    }
  }

  if ( bCallReset )
    Reset();

  return rc;
}